

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundfiles.c
# Opt level: O2

int ps_config_wavfile(ps_config_t *config,FILE *infh,char *file)

{
  int32 iVar1;
  int32 iVar2;
  char acVar3 [4];
  size_t sVar4;
  long lVar5;
  void *pvVar6;
  char *fmt;
  long ln;
  char *pcVar7;
  int iVar8;
  size_t __size;
  ulong __size_00;
  bool bVar9;
  long lStack_50;
  int16 shortval;
  int32 intval;
  char id [4];
  
  pcVar7 = "(input filehandle)";
  if (file != (char *)0x0) {
    pcVar7 = file;
  }
  ps_config_set_str(config,"input_endian","little");
  sVar4 = fread(id,1,4,(FILE *)infh);
  if (sVar4 == 4) {
    sVar4 = fread(&intval,4,1,(FILE *)infh);
    if (sVar4 == 1) {
      sVar4 = fread(id,1,4,(FILE *)infh);
      if (sVar4 == 4) {
        if (id != (char  [4])0x45564157) {
          fmt = "%s is not a WAVE file\n";
          lVar5 = 0x78;
          goto LAB_0010c9c8;
        }
        sVar4 = fread(id,1,4,(FILE *)infh);
        if (sVar4 == 4) {
          if (id != (char  [4])0x20746d66) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                    ,0x7f,"Format chunk missing\n");
            return -1;
          }
          sVar4 = fread(&intval,4,1,(FILE *)infh);
          iVar1 = intval;
          if (sVar4 == 1) {
            sVar4 = fread(&shortval,2,1,(FILE *)infh);
            if (sVar4 == 1) {
              if (shortval != 1) {
                fmt = "%s is not in PCM format\n";
                lVar5 = 0x8c;
LAB_0010c9c8:
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                        ,lVar5,fmt,pcVar7);
                return -1;
              }
              sVar4 = fread(&shortval,2,1,(FILE *)infh);
              if (sVar4 == 1) {
                if (shortval != 1) {
                  fmt = "%s is not single channel\n";
                  lVar5 = 0x95;
                  goto LAB_0010c9c8;
                }
                sVar4 = fread(&intval,4,1,(FILE *)infh);
                if (sVar4 == 1) {
                  lVar5 = ps_config_int(config,"samprate");
                  if (lVar5 == 0) {
                    ps_config_set_int(config,"samprate",(long)intval);
                  }
                  else {
                    lVar5 = ps_config_int(config,"samprate");
                    iVar2 = intval;
                    if (lVar5 != intval) {
                      lVar5 = ps_config_int(config,"samprate");
                      err_msg(ERR_WARN,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                              ,0xa1,"WAVE file sampling rate %d != samprate %d\n",(ulong)(uint)iVar2
                              ,lVar5);
                    }
                  }
                  sVar4 = fread(&intval,4,1,(FILE *)infh);
                  if (sVar4 == 1) {
                    sVar4 = fread(&shortval,2,1,(FILE *)infh);
                    if (sVar4 == 1) {
                      sVar4 = fread(&shortval,2,1,(FILE *)infh);
                      if (sVar4 == 1) {
                        if (shortval != 0x10) {
                          fmt = "%s is not 16-bit\n";
                          lVar5 = 0xae;
                          goto LAB_0010c9c8;
                        }
                        iVar8 = 0;
                        if (0x10 < iVar1) {
                          __size_00 = (ulong)(iVar1 - 0x10);
                          pvVar6 = malloc(__size_00);
                          sVar4 = fread(pvVar6,1,__size_00,(FILE *)infh);
                          iVar8 = 0;
                          if (sVar4 != __size_00) {
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xb8,"%s: Failed to read extra header",pcVar7);
                            iVar8 = -1;
                          }
                          ckd_free(pvVar6);
                          if (sVar4 != __size_00) {
                            return iVar8;
                          }
                        }
                        while( true ) {
                          sVar4 = fread(id,1,4,(FILE *)infh);
                          acVar3 = id;
                          if (sVar4 != 4) {
                            lVar5 = 4;
                            ln = 0xc2;
                            goto LAB_0010ca16;
                          }
                          sVar4 = fread(&intval,4,1,(FILE *)infh);
                          if (acVar3 == (char  [4])0x61746164) break;
                          if (sVar4 != 1) {
                            lStack_50 = 4;
                            ln = 0xcc;
                            lVar5 = lStack_50;
                            goto LAB_0010ca16;
                          }
                          __size = (size_t)intval;
                          pvVar6 = malloc(__size);
                          sVar4 = fread(pvVar6,1,__size,(FILE *)infh);
                          if (sVar4 != __size) {
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                                           ,0xd1,"%s: Failed to read %s chunk",pcVar7,id);
                            iVar8 = -1;
                          }
                          ckd_free(pvVar6);
                          bVar9 = iVar8 == -1;
                          iVar8 = 0;
                          if (bVar9) {
                            return -1;
                          }
                        }
                        if (sVar4 == 1) {
                          return iVar8;
                        }
                        lVar5 = 4;
                        ln = 0xc5;
                      }
                      else {
                        lVar5 = 2;
                        ln = 0xab;
                      }
                    }
                    else {
                      lVar5 = 2;
                      ln = 0xa8;
                    }
                  }
                  else {
                    lVar5 = 4;
                    ln = 0xa5;
                  }
                }
                else {
                  lVar5 = 4;
                  ln = 0x9b;
                }
              }
              else {
                lVar5 = 2;
                ln = 0x92;
              }
            }
            else {
              lVar5 = 2;
              ln = 0x89;
            }
          }
          else {
            lVar5 = 4;
            ln = 0x84;
          }
          goto LAB_0010ca16;
        }
        lStack_50 = 0x7d;
      }
      else {
        lStack_50 = 0x76;
      }
    }
    else {
      lStack_50 = 0x74;
    }
  }
  else {
    lStack_50 = 0x72;
  }
  lVar5 = 4;
  ln = lStack_50;
LAB_0010ca16:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/soundfiles.c"
                 ,ln,"Failed to read %d bytes",lVar5);
  return -1;
}

Assistant:

int
ps_config_wavfile(ps_config_t *config, FILE *infh, const char *file)
{
    char id[4];
    int32 intval, header_len;
    int16 shortval;
    int rv = 0;

    if (file == NULL)
        file = "(input filehandle)";
        
    /* RIFF files are little-endian by definition. */
    ps_config_set_str(config, "input_endian", "little");

    /* Read in all the header chunks and etcetera. */
    TRY_FREAD(id, 1, 4, infh);
    /* Total file length (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);
    /* 'WAVE' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "WAVE", 4)) {
        E_ERROR("%s is not a WAVE file\n", file);
        rv = -1;
        goto error_out;
    }
    /* 'fmt ' */
    TRY_FREAD(id, 1, 4, infh);
    if (0 != memcmp(id, "fmt ", 4)) {
        E_ERROR("Format chunk missing\n");
        rv = -1;
        goto error_out;
    }
    /* Length of 'fmt ' chunk */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    header_len = intval;

    /* Data format. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not in PCM format\n", file);
        rv = -1;
        goto error_out;
    }

    /* Number of channels. */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 1) { /* PCM */
        E_ERROR("%s is not single channel\n", file);
        rv = -1;
        goto error_out;
    }

    /* Sampling rate (finally!) */
    TRY_FREAD(&intval, 4, 1, infh);
    SWAP_LE_32(&intval);
    if (ps_config_int(config, "samprate") == 0)
        ps_config_set_int(config, "samprate", intval);
    else if (ps_config_int(config, "samprate") != intval) {
        E_WARN("WAVE file sampling rate %d != samprate %d\n",
               intval, ps_config_int(config, "samprate"));
    }

    /* Average bytes per second (we don't care) */
    TRY_FREAD(&intval, 4, 1, infh);

    /* Block alignment (we don't care) */
    TRY_FREAD(&shortval, 2, 1, infh);

    /* Bits per sample (must be 16) */
    TRY_FREAD(&shortval, 2, 1, infh);
    SWAP_LE_16(&shortval);
    if (shortval != 16) {
        E_ERROR("%s is not 16-bit\n", file);
        rv = -1;
        goto error_out;
    }

    /* Any extra parameters. */
    if (header_len > 16) {
        /* Avoid seeking... */
        char *spam = malloc(header_len - 16);
        if (fread(spam, 1, header_len - 16, infh) != (size_t)(header_len - 16)) {
            E_ERROR_SYSTEM("%s: Failed to read extra header", file);
            rv = -1;
        }
        ckd_free(spam);
        if (rv == -1)
            goto error_out;
    }

    /* Now skip to the 'data' chunk. */
    while (1) {
        TRY_FREAD(id, 1, 4, infh);
        if (0 == memcmp(id, "data", 4)) {
            /* Total number of bytes of data (we don't care). */
            TRY_FREAD(&intval, 4, 1, infh);
            break;
        }
        else {
            char *spam;
            /* Some other stuff... */
            /* Number of bytes of ... whatever */
            TRY_FREAD(&intval, 4, 1, infh);
            SWAP_LE_32(&intval);
            /* Avoid seeking... */
            spam = malloc(intval);
            if (fread(spam, 1, intval, infh) != (size_t)intval) {
                E_ERROR_SYSTEM("%s: Failed to read %s chunk", file, id);
                rv = -1;
            }
            ckd_free(spam);
            if (rv == -1)
                goto error_out;
        }
    }

error_out:
    return rv;
}